

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_seq_executor.cpp
# Opt level: O0

void __thiscall Worker::Worker(Worker *this,string *name)

{
  Worker *local_68;
  code *local_60;
  undefined8 local_58;
  type local_50;
  int local_34;
  subsecond_duration<boost::posix_time::time_duration,_1000L> local_30 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *name_local;
  Worker *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  boost::asio::io_context::io_context(&this->m_ios);
  std::__cxx11::string::string((string *)&this->m_name,local_18);
  local_34 = 1;
  boost::date_time::subsecond_duration<boost::posix_time::time_duration,_1000L>::
  subsecond_duration<int>(local_30,&local_34,(type *)0x0);
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_deadline_timer<boost::asio::io_context>
            (&this->m_wrkTimer,&this->m_ios,&local_30[0].super_time_duration,(type *)0x0);
  local_60 = run;
  local_58 = 0;
  local_68 = this;
  std::bind<void(Worker::*)(),Worker*>(&local_50,(offset_in_Worker_to_subr *)&local_60,&local_68);
  std::thread::thread<std::_Bind<void(Worker::*(Worker*))()>,,void>(&this->m_thread,&local_50);
  this->m_stopFlag = false;
  std::atomic<unsigned_long>::atomic(&this->m_pendingJobCount,0);
  std::atomic<unsigned_long>::atomic(&this->m_jobCount,0);
  this->m_processedJobs = 0;
  return;
}

Assistant:

Worker(const std::string& name)
		: m_name {name},
		  m_wrkTimer {m_ios, boost::posix_time::milliseconds(1)},
		  m_thread{std::bind(&Worker::run, this)},
          m_stopFlag{false},
          m_pendingJobCount{0},
          m_jobCount{0},
          m_processedJobs{0}
	{
		//std::cout << "Worker " << name << " is created" << std::endl;
	}